

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCascade.c
# Opt level: O0

int Abc_ResMigrate(DdManager *dd,DdNode *bFunc,int nInputs,uint *uParts,int iPart1,int iPart2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  int local_4c;
  int fChange;
  int CostBest;
  int CostCur;
  int k;
  int i;
  uint uParts2 [2];
  int iPart2_local;
  int iPart1_local;
  uint *uParts_local;
  int nInputs_local;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  k = uParts[iPart1];
  i = uParts[iPart2];
  local_4c = 0;
  if ((uParts[iPart1] & uParts[iPart2]) == 0) {
    iVar1 = Abc_ResCost(dd,bFunc,uParts[iPart1],(int *)0x0,(int *)0x0);
    iVar2 = Abc_ResCost(dd,bFunc,uParts[iPart2],(int *)0x0,(int *)0x0);
    for (CostCur = 0; CostCur < nInputs; CostCur = CostCur + 1) {
      bVar5 = (byte)CostCur;
      if ((uParts[iPart1] & 1 << (bVar5 & 0x1f)) != 0) {
        for (CostBest = 0; CostBest < nInputs; CostBest = CostBest + 1) {
          bVar6 = (byte)CostBest;
          if (((uParts[iPart2] & 1 << (bVar6 & 0x1f)) != 0) && (CostCur != CostBest)) {
            uParts[iPart1] = (1 << (bVar5 & 0x1f) | 1 << (bVar6 & 0x1f)) ^ uParts[iPart1];
            uParts[iPart2] = (1 << (bVar5 & 0x1f) | 1 << (bVar6 & 0x1f)) ^ uParts[iPart2];
            iVar3 = Abc_ResCost(dd,bFunc,uParts[iPart1],(int *)0x0,(int *)0x0);
            iVar4 = Abc_ResCost(dd,bFunc,uParts[iPart2],(int *)0x0,(int *)0x0);
            if (iVar3 + iVar4 < iVar1 + iVar2) {
              k = uParts[iPart1];
              i = uParts[iPart2];
              local_4c = 1;
            }
            uParts[iPart1] = (1 << (bVar5 & 0x1f) | 1 << (bVar6 & 0x1f)) ^ uParts[iPart1];
            uParts[iPart2] = (1 << (bVar5 & 0x1f) | 1 << (bVar6 & 0x1f)) ^ uParts[iPart2];
          }
        }
      }
    }
    uParts[iPart1] = k;
    uParts[iPart2] = i;
    return local_4c;
  }
  __assert_fail("(uParts[iPart1] & uParts[iPart2]) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                ,0x13f,"int Abc_ResMigrate(DdManager *, DdNode *, int, unsigned int *, int, int)");
}

Assistant:

int Abc_ResMigrate( DdManager * dd, DdNode * bFunc, int nInputs, unsigned uParts[], int iPart1, int iPart2 )
{
    unsigned uParts2[2] = { uParts[iPart1], uParts[iPart2] };
    int i, k, CostCur, CostBest, fChange = 0;
    assert( (uParts[iPart1] & uParts[iPart2]) == 0 );
    CostBest = Abc_ResCost( dd, bFunc, uParts[iPart1], NULL, NULL ) 
             + Abc_ResCost( dd, bFunc, uParts[iPart2], NULL, NULL );
    for ( i = 0; i < nInputs; i++ )
    if ( uParts[iPart1] & (1 << i) )
    {
        for ( k = 0; k < nInputs; k++ )
        if ( uParts[iPart2] & (1 << k) )
        {
            if ( i == k )
                continue;
            uParts[iPart1] ^= (1 << i) | (1 << k);
            uParts[iPart2] ^= (1 << i) | (1 << k);
            CostCur = Abc_ResCost( dd, bFunc, uParts[iPart1], NULL, NULL ) + Abc_ResCost( dd, bFunc, uParts[iPart2], NULL, NULL );
            if ( CostCur < CostBest )
            {
                CostCur    = CostBest;
                uParts2[0] = uParts[iPart1];
                uParts2[1] = uParts[iPart2];
                fChange = 1;
            }
            uParts[iPart1] ^= (1 << i) | (1 << k);
            uParts[iPart2] ^= (1 << i) | (1 << k);
        }
    }
    uParts[iPart1] = uParts2[0];
    uParts[iPart2] = uParts2[1];
    return fChange;
}